

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

int SaveBinary3dos(path *fname,aint start,aint length,byte type,word w2,word w3)

{
  pointer pcVar1;
  FILE *__s;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  char **ppcVar5;
  int iVar6;
  byte bVar7;
  byte p3dos_header [128];
  char *local_b8;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  byte local_a9;
  char local_a8;
  undefined1 uStack_a7;
  undefined2 uStack_a6;
  word wStack_a4;
  undefined2 uStack_a2;
  char local_39;
  
  bVar7 = 0;
  __s = (FILE *)SJ_fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
    Error("opening file for write",local_b8,FATAL);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT26(uStack_a2,
                                        CONCAT24(wStack_a4,
                                                 CONCAT13(uStack_a6._1_1_,
                                                          CONCAT12((undefined1)uStack_a6,
                                                                   CONCAT11(uStack_a7,local_a8)))))
                               + 1);
    }
  }
  puVar4 = &DAT_001691e0;
  ppcVar5 = &local_b8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *ppcVar5 = (char *)*puVar4;
    puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    ppcVar5 = ppcVar5 + (ulong)bVar7 * -2 + 1;
  }
  iVar6 = length + 0x80;
  local_ad = (char)iVar6;
  local_ac = (char)((uint)iVar6 >> 8);
  local_ab = (char)((uint)iVar6 >> 0x10);
  local_aa = (char)((uint)iVar6 >> 0x18);
  local_a9 = type;
  local_a8 = (char)length;
  uStack_a7 = (char)((uint)length >> 8);
  uStack_a6 = w2;
  wStack_a4 = w3;
  local_39 = '\0';
  lVar3 = 0;
  do {
    local_39 = local_39 + *(char *)((long)&local_b8 + lVar3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  sVar2 = fwrite(&local_b8,1,0x80,__s);
  iVar6 = 0;
  if ((int)sVar2 == 0x80) {
    iVar6 = SaveRAM((FILE *)__s,start,length);
  }
  fclose(__s);
  return iVar6;
}

Assistant:

int SaveBinary3dos(const std::filesystem::path & fname, aint start, aint length, byte type, word w2, word w3) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	// prepare +3DOS 128 byte header content
	constexpr aint hsize = 128;
	const aint full_length = hsize + length;
	byte sum = 0, p3dos_header[hsize] { "PLUS3DOS\032\001" };
	p3dos_header[11] = byte(full_length>>0);
	p3dos_header[12] = byte(full_length>>8);
	p3dos_header[13] = byte(full_length>>16);
	p3dos_header[14] = byte(full_length>>24);
	// +3 BASIC 8 byte header filled with "relevant values"
	p3dos_header[15+0] = type;
	p3dos_header[15+1] = byte(length>>0);
	p3dos_header[15+2] = byte(length>>8);
	p3dos_header[15+3] = byte(w2>>0);
	p3dos_header[15+4] = byte(w2>>8);
	p3dos_header[15+5] = byte(w3>>0);
	p3dos_header[15+6] = byte(w3>>8);
	// calculat checksum of the header
	for (const byte v : p3dos_header) sum += v;
	p3dos_header[hsize-1] = sum;
	// write header and data
	int result = (hsize == (aint) fwrite(p3dos_header, 1, hsize, ff)) ? SaveRAM(ff, start, length) : 0;
	fclose(ff);
	return result;
}